

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  long lVar37;
  ulong uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  uint uVar55;
  ulong uVar56;
  long lVar57;
  Scene *pSVar58;
  ulong uVar59;
  ulong *puVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar110;
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_df8;
  undefined1 local_cf0 [16];
  undefined1 (*local_cd8) [16];
  long local_cd0;
  ulong local_cc8;
  undefined1 local_cc0 [32];
  RTCFilterFunctionNArguments local_c90;
  Scene *local_c60;
  undefined1 auStack_c58 [24];
  long local_c40;
  undefined1 auStack_c38 [24];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined4 local_bd0;
  undefined4 uStack_bcc;
  undefined4 uStack_bc8;
  undefined4 uStack_bc4;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined4 local_ba0;
  undefined4 uStack_b9c;
  undefined4 uStack_b98;
  undefined4 uStack_b94;
  undefined1 local_b90 [16];
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined1 local_b70 [16];
  uint local_b60;
  uint uStack_b5c;
  uint uStack_b58;
  uint uStack_b54;
  uint uStack_b50;
  uint uStack_b4c;
  uint uStack_b48;
  uint uStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  undefined4 uStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar103._4_4_ = uVar1;
  auVar103._0_4_ = uVar1;
  auVar103._8_4_ = uVar1;
  auVar103._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar107._4_4_ = uVar1;
  auVar107._0_4_ = uVar1;
  auVar107._8_4_ = uVar1;
  auVar107._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar111._4_4_ = uVar1;
  auVar111._0_4_ = uVar1;
  auVar111._8_4_ = uVar1;
  auVar111._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar31 = fVar2 * 0.99999964;
  fVar32 = fVar3 * 0.99999964;
  fVar33 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_cc8 = uVar61 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar84._4_4_ = iVar5;
  auVar84._0_4_ = iVar5;
  auVar84._8_4_ = iVar5;
  auVar84._12_4_ = iVar5;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar89._4_4_ = iVar5;
  auVar89._0_4_ = iVar5;
  auVar89._8_4_ = iVar5;
  auVar89._12_4_ = iVar5;
  local_b20._16_16_ = mm_lookupmask_ps._240_16_;
  local_b20._0_16_ = mm_lookupmask_ps._0_16_;
  local_cd8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  auVar66._8_4_ = 0xbf800000;
  auVar66._0_8_ = 0xbf800000bf800000;
  auVar66._12_4_ = 0xbf800000;
  auVar66._16_4_ = 0xbf800000;
  auVar66._20_4_ = 0xbf800000;
  auVar66._24_4_ = 0xbf800000;
  auVar66._28_4_ = 0xbf800000;
  _local_b40 = vblendvps_avx(auVar78,auVar66,local_b20);
  local_df8 = local_7f8;
LAB_0158cc17:
  do {
    puVar60 = local_df8;
    if (puVar60 == &local_800) {
LAB_0158d6f3:
      return puVar60 != &local_800;
    }
    local_df8 = puVar60 + -1;
    uVar64 = puVar60[-1];
    while ((uVar64 & 8) == 0) {
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar61),auVar103);
      auVar65._0_4_ = fVar31 * auVar34._0_4_;
      auVar65._4_4_ = fVar31 * auVar34._4_4_;
      auVar65._8_4_ = fVar31 * auVar34._8_4_;
      auVar65._12_4_ = fVar31 * auVar34._12_4_;
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar63),auVar107);
      auVar69._0_4_ = fVar32 * auVar34._0_4_;
      auVar69._4_4_ = fVar32 * auVar34._4_4_;
      auVar69._8_4_ = fVar32 * auVar34._8_4_;
      auVar69._12_4_ = fVar32 * auVar34._12_4_;
      auVar34 = vmaxps_avx(auVar65,auVar69);
      auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar62),auVar111);
      auVar70._0_4_ = fVar33 * auVar65._0_4_;
      auVar70._4_4_ = fVar33 * auVar65._4_4_;
      auVar70._8_4_ = fVar33 * auVar65._8_4_;
      auVar70._12_4_ = fVar33 * auVar65._12_4_;
      auVar65 = vmaxps_avx(auVar70,auVar84);
      auVar34 = vmaxps_avx(auVar34,auVar65);
      auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + local_cc8),auVar103);
      auVar71._0_4_ = fVar2 * auVar65._0_4_;
      auVar71._4_4_ = fVar2 * auVar65._4_4_;
      auVar71._8_4_ = fVar2 * auVar65._8_4_;
      auVar71._12_4_ = fVar2 * auVar65._12_4_;
      auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + (uVar63 ^ 0x10)),auVar107);
      auVar75._0_4_ = fVar3 * auVar65._0_4_;
      auVar75._4_4_ = fVar3 * auVar65._4_4_;
      auVar75._8_4_ = fVar3 * auVar65._8_4_;
      auVar75._12_4_ = fVar3 * auVar65._12_4_;
      auVar65 = vminps_avx(auVar71,auVar75);
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + (uVar62 ^ 0x10)),auVar111);
      auVar76._0_4_ = fVar4 * auVar69._0_4_;
      auVar76._4_4_ = fVar4 * auVar69._4_4_;
      auVar76._8_4_ = fVar4 * auVar69._8_4_;
      auVar76._12_4_ = fVar4 * auVar69._12_4_;
      auVar69 = vminps_avx(auVar76,auVar89);
      auVar65 = vminps_avx(auVar65,auVar69);
      auVar34 = vcmpps_avx(auVar34,auVar65,2);
      uVar55 = vmovmskps_avx(auVar34);
      if (uVar55 == 0) goto LAB_0158cc17;
      uVar55 = uVar55 & 0xff;
      uVar56 = uVar64 & 0xfffffffffffffff0;
      lVar37 = 0;
      for (uVar64 = (ulong)uVar55; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar64 = *(ulong *)(uVar56 + lVar37 * 8);
      uVar55 = uVar55 - 1 & uVar55;
      uVar59 = (ulong)uVar55;
      if (uVar55 != 0) {
        do {
          *local_df8 = uVar64;
          local_df8 = local_df8 + 1;
          lVar37 = 0;
          for (uVar64 = uVar59; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar59 = uVar59 - 1 & uVar59;
          uVar64 = *(ulong *)(uVar56 + lVar37 * 8);
        } while (uVar59 != 0);
      }
    }
    local_cd0 = (ulong)((uint)uVar64 & 0xf) - 8;
    uVar64 = uVar64 & 0xfffffffffffffff0;
    for (local_c40 = 0; local_c40 != local_cd0; local_c40 = local_c40 + 1) {
      lVar57 = local_c40 * 0xe0;
      lVar37 = uVar64 + 0xd0 + lVar57;
      local_a00 = *(undefined8 *)(lVar37 + 0x10);
      uStack_9f8 = *(undefined8 *)(lVar37 + 0x18);
      lVar37 = uVar64 + 0xc0 + lVar57;
      local_9e0 = *(undefined8 *)(lVar37 + 0x10);
      uStack_9d8 = *(undefined8 *)(lVar37 + 0x18);
      uStack_9d0 = local_9e0;
      uStack_9c8 = uStack_9d8;
      uStack_9f0 = local_a00;
      uStack_9e8 = uStack_9f8;
      auVar85._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x60 + lVar57);
      auVar85._0_16_ = *(undefined1 (*) [16])(uVar64 + lVar57);
      auVar73._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x70 + lVar57);
      auVar73._0_16_ = *(undefined1 (*) [16])(uVar64 + 0x10 + lVar57);
      auVar102._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x80 + lVar57);
      auVar102._0_16_ = *(undefined1 (*) [16])(uVar64 + 0x20 + lVar57);
      auVar34 = *(undefined1 (*) [16])(uVar64 + 0x30 + lVar57);
      auVar108._16_16_ = auVar34;
      auVar108._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar64 + 0x40 + lVar57);
      auVar90._16_16_ = auVar34;
      auVar90._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar64 + 0x50 + lVar57);
      auVar94._16_16_ = auVar34;
      auVar94._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar64 + 0x90 + lVar57);
      auVar104._16_16_ = auVar34;
      auVar104._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar64 + 0xa0 + lVar57);
      auVar125._16_16_ = auVar34;
      auVar125._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar64 + 0xb0 + lVar57);
      auVar67._16_16_ = auVar34;
      auVar67._0_16_ = auVar34;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar121._4_4_ = uVar1;
      auVar121._0_4_ = uVar1;
      auVar121._8_4_ = uVar1;
      auVar121._12_4_ = uVar1;
      auVar121._16_4_ = uVar1;
      auVar121._20_4_ = uVar1;
      auVar121._24_4_ = uVar1;
      auVar121._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar123._4_4_ = uVar1;
      auVar123._0_4_ = uVar1;
      auVar123._8_4_ = uVar1;
      auVar123._12_4_ = uVar1;
      auVar123._16_4_ = uVar1;
      auVar123._20_4_ = uVar1;
      auVar123._24_4_ = uVar1;
      auVar123._28_4_ = uVar1;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar124._4_4_ = uVar6;
      auVar124._0_4_ = uVar6;
      auVar124._8_4_ = uVar6;
      auVar124._12_4_ = uVar6;
      auVar124._16_4_ = uVar6;
      auVar124._20_4_ = uVar6;
      auVar124._24_4_ = uVar6;
      auVar124._28_4_ = uVar6;
      auVar85 = vsubps_avx(auVar85,auVar121);
      local_cc0 = vsubps_avx(auVar73,auVar123);
      local_c00 = vsubps_avx(auVar102,auVar124);
      auVar66 = vsubps_avx(auVar108,auVar121);
      auVar78 = vsubps_avx(auVar90,auVar123);
      auVar83 = vsubps_avx(auVar94,auVar124);
      auVar73 = vsubps_avx(auVar104,auVar121);
      auVar90 = vsubps_avx(auVar125,auVar123);
      auVar35 = vsubps_avx(auVar67,auVar124);
      auVar67 = vsubps_avx(auVar73,auVar85);
      local_a20 = vsubps_avx(auVar90,local_cc0);
      auVar94 = vsubps_avx(auVar35,local_c00);
      auVar68._0_4_ = auVar85._0_4_ + auVar73._0_4_;
      auVar68._4_4_ = auVar85._4_4_ + auVar73._4_4_;
      auVar68._8_4_ = auVar85._8_4_ + auVar73._8_4_;
      auVar68._12_4_ = auVar85._12_4_ + auVar73._12_4_;
      auVar68._16_4_ = auVar85._16_4_ + auVar73._16_4_;
      auVar68._20_4_ = auVar85._20_4_ + auVar73._20_4_;
      auVar68._24_4_ = auVar85._24_4_ + auVar73._24_4_;
      auVar68._28_4_ = auVar85._28_4_ + auVar73._28_4_;
      auVar105._0_4_ = auVar90._0_4_ + local_cc0._0_4_;
      auVar105._4_4_ = auVar90._4_4_ + local_cc0._4_4_;
      auVar105._8_4_ = auVar90._8_4_ + local_cc0._8_4_;
      auVar105._12_4_ = auVar90._12_4_ + local_cc0._12_4_;
      auVar105._16_4_ = auVar90._16_4_ + local_cc0._16_4_;
      auVar105._20_4_ = auVar90._20_4_ + local_cc0._20_4_;
      auVar105._24_4_ = auVar90._24_4_ + local_cc0._24_4_;
      auVar105._28_4_ = auVar90._28_4_ + local_cc0._28_4_;
      fVar9 = local_c00._0_4_;
      auVar91._0_4_ = auVar35._0_4_ + fVar9;
      fVar10 = local_c00._4_4_;
      auVar91._4_4_ = auVar35._4_4_ + fVar10;
      fVar11 = local_c00._8_4_;
      auVar91._8_4_ = auVar35._8_4_ + fVar11;
      fVar12 = local_c00._12_4_;
      auVar91._12_4_ = auVar35._12_4_ + fVar12;
      fVar13 = local_c00._16_4_;
      auVar91._16_4_ = auVar35._16_4_ + fVar13;
      fVar14 = local_c00._20_4_;
      auVar91._20_4_ = auVar35._20_4_ + fVar14;
      fVar15 = local_c00._24_4_;
      auVar91._24_4_ = auVar35._24_4_ + fVar15;
      fVar114 = auVar35._28_4_;
      auVar91._28_4_ = fVar114 + local_c00._28_4_;
      auVar36._4_4_ = auVar94._4_4_ * auVar105._4_4_;
      auVar36._0_4_ = auVar94._0_4_ * auVar105._0_4_;
      auVar36._8_4_ = auVar94._8_4_ * auVar105._8_4_;
      auVar36._12_4_ = auVar94._12_4_ * auVar105._12_4_;
      auVar36._16_4_ = auVar94._16_4_ * auVar105._16_4_;
      auVar36._20_4_ = auVar94._20_4_ * auVar105._20_4_;
      auVar36._24_4_ = auVar94._24_4_ * auVar105._24_4_;
      auVar36._28_4_ = uVar1;
      auVar65 = vfmsub231ps_fma(auVar36,local_a20,auVar91);
      auVar39._4_4_ = auVar67._4_4_ * auVar91._4_4_;
      auVar39._0_4_ = auVar67._0_4_ * auVar91._0_4_;
      auVar39._8_4_ = auVar67._8_4_ * auVar91._8_4_;
      auVar39._12_4_ = auVar67._12_4_ * auVar91._12_4_;
      auVar39._16_4_ = auVar67._16_4_ * auVar91._16_4_;
      auVar39._20_4_ = auVar67._20_4_ * auVar91._20_4_;
      auVar39._24_4_ = auVar67._24_4_ * auVar91._24_4_;
      auVar39._28_4_ = auVar91._28_4_;
      auVar34 = vfmsub231ps_fma(auVar39,auVar94,auVar68);
      auVar40._4_4_ = local_a20._4_4_ * auVar68._4_4_;
      auVar40._0_4_ = local_a20._0_4_ * auVar68._0_4_;
      auVar40._8_4_ = local_a20._8_4_ * auVar68._8_4_;
      auVar40._12_4_ = local_a20._12_4_ * auVar68._12_4_;
      auVar40._16_4_ = local_a20._16_4_ * auVar68._16_4_;
      auVar40._20_4_ = local_a20._20_4_ * auVar68._20_4_;
      auVar40._24_4_ = local_a20._24_4_ * auVar68._24_4_;
      auVar40._28_4_ = auVar68._28_4_;
      auVar69 = vfmsub231ps_fma(auVar40,auVar67,auVar105);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar122._4_4_ = uVar1;
      auVar122._0_4_ = uVar1;
      auVar122._8_4_ = uVar1;
      auVar122._12_4_ = uVar1;
      auVar122._16_4_ = uVar1;
      auVar122._20_4_ = uVar1;
      auVar122._24_4_ = uVar1;
      auVar122._28_4_ = uVar1;
      local_a60 = *(float *)(ray + k * 4 + 0x60);
      auVar41._4_4_ = local_a60 * auVar69._4_4_;
      auVar41._0_4_ = local_a60 * auVar69._0_4_;
      auVar41._8_4_ = local_a60 * auVar69._8_4_;
      auVar41._12_4_ = local_a60 * auVar69._12_4_;
      auVar41._16_4_ = local_a60 * 0.0;
      auVar41._20_4_ = local_a60 * 0.0;
      auVar41._24_4_ = local_a60 * 0.0;
      auVar41._28_4_ = fVar114;
      auVar34 = vfmadd231ps_fma(auVar41,auVar122,ZEXT1632(auVar34));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_a40._4_4_ = uVar1;
      local_a40._0_4_ = uVar1;
      local_a40._8_4_ = uVar1;
      local_a40._12_4_ = uVar1;
      local_a40._16_4_ = uVar1;
      local_a40._20_4_ = uVar1;
      local_a40._24_4_ = uVar1;
      local_a40._28_4_ = uVar1;
      auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),local_a40,ZEXT1632(auVar65));
      local_a80 = vsubps_avx(local_cc0,auVar78);
      local_aa0 = vsubps_avx(local_c00,auVar83);
      auVar79._0_4_ = auVar78._0_4_ + local_cc0._0_4_;
      auVar79._4_4_ = auVar78._4_4_ + local_cc0._4_4_;
      auVar79._8_4_ = auVar78._8_4_ + local_cc0._8_4_;
      auVar79._12_4_ = auVar78._12_4_ + local_cc0._12_4_;
      auVar79._16_4_ = auVar78._16_4_ + local_cc0._16_4_;
      auVar79._20_4_ = auVar78._20_4_ + local_cc0._20_4_;
      auVar79._24_4_ = auVar78._24_4_ + local_cc0._24_4_;
      auVar79._28_4_ = auVar78._28_4_ + local_cc0._28_4_;
      auVar92._0_4_ = fVar9 + auVar83._0_4_;
      auVar92._4_4_ = fVar10 + auVar83._4_4_;
      auVar92._8_4_ = fVar11 + auVar83._8_4_;
      auVar92._12_4_ = fVar12 + auVar83._12_4_;
      auVar92._16_4_ = fVar13 + auVar83._16_4_;
      auVar92._20_4_ = fVar14 + auVar83._20_4_;
      auVar92._24_4_ = fVar15 + auVar83._24_4_;
      fVar110 = auVar83._28_4_;
      auVar92._28_4_ = local_c00._28_4_ + fVar110;
      fVar96 = local_aa0._0_4_;
      fVar99 = local_aa0._4_4_;
      auVar42._4_4_ = auVar79._4_4_ * fVar99;
      auVar42._0_4_ = auVar79._0_4_ * fVar96;
      fVar16 = local_aa0._8_4_;
      auVar42._8_4_ = auVar79._8_4_ * fVar16;
      fVar19 = local_aa0._12_4_;
      auVar42._12_4_ = auVar79._12_4_ * fVar19;
      fVar22 = local_aa0._16_4_;
      auVar42._16_4_ = auVar79._16_4_ * fVar22;
      fVar25 = local_aa0._20_4_;
      auVar42._20_4_ = auVar79._20_4_ * fVar25;
      fVar28 = local_aa0._24_4_;
      auVar42._24_4_ = auVar79._24_4_ * fVar28;
      auVar42._28_4_ = auVar105._28_4_;
      auVar69 = vfmsub231ps_fma(auVar42,local_a80,auVar92);
      local_ac0 = vsubps_avx(auVar85,auVar66);
      fVar97 = local_ac0._0_4_;
      fVar100 = local_ac0._4_4_;
      auVar43._4_4_ = auVar92._4_4_ * fVar100;
      auVar43._0_4_ = auVar92._0_4_ * fVar97;
      fVar17 = local_ac0._8_4_;
      auVar43._8_4_ = auVar92._8_4_ * fVar17;
      fVar20 = local_ac0._12_4_;
      auVar43._12_4_ = auVar92._12_4_ * fVar20;
      fVar23 = local_ac0._16_4_;
      auVar43._16_4_ = auVar92._16_4_ * fVar23;
      fVar26 = local_ac0._20_4_;
      auVar43._20_4_ = auVar92._20_4_ * fVar26;
      fVar29 = local_ac0._24_4_;
      auVar43._24_4_ = auVar92._24_4_ * fVar29;
      auVar43._28_4_ = auVar92._28_4_;
      auVar112._0_4_ = auVar85._0_4_ + auVar66._0_4_;
      auVar112._4_4_ = auVar85._4_4_ + auVar66._4_4_;
      auVar112._8_4_ = auVar85._8_4_ + auVar66._8_4_;
      auVar112._12_4_ = auVar85._12_4_ + auVar66._12_4_;
      auVar112._16_4_ = auVar85._16_4_ + auVar66._16_4_;
      auVar112._20_4_ = auVar85._20_4_ + auVar66._20_4_;
      auVar112._24_4_ = auVar85._24_4_ + auVar66._24_4_;
      auVar112._28_4_ = auVar85._28_4_ + auVar66._28_4_;
      auVar65 = vfmsub231ps_fma(auVar43,local_aa0,auVar112);
      fVar98 = local_a80._0_4_;
      fVar101 = local_a80._4_4_;
      auVar44._4_4_ = auVar112._4_4_ * fVar101;
      auVar44._0_4_ = auVar112._0_4_ * fVar98;
      fVar18 = local_a80._8_4_;
      auVar44._8_4_ = auVar112._8_4_ * fVar18;
      fVar21 = local_a80._12_4_;
      auVar44._12_4_ = auVar112._12_4_ * fVar21;
      fVar24 = local_a80._16_4_;
      auVar44._16_4_ = auVar112._16_4_ * fVar24;
      fVar27 = local_a80._20_4_;
      auVar44._20_4_ = auVar112._20_4_ * fVar27;
      fVar30 = local_a80._24_4_;
      auVar44._24_4_ = auVar112._24_4_ * fVar30;
      auVar44._28_4_ = auVar112._28_4_;
      auVar70 = vfmsub231ps_fma(auVar44,local_ac0,auVar79);
      auVar113._0_4_ = auVar70._0_4_ * local_a60;
      auVar113._4_4_ = auVar70._4_4_ * local_a60;
      auVar113._8_4_ = auVar70._8_4_ * local_a60;
      auVar113._12_4_ = auVar70._12_4_ * local_a60;
      auVar113._16_4_ = local_a60 * 0.0;
      auVar113._20_4_ = local_a60 * 0.0;
      auVar113._24_4_ = local_a60 * 0.0;
      auVar113._28_4_ = 0;
      auVar65 = vfmadd231ps_fma(auVar113,auVar122,ZEXT1632(auVar65));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),local_a40,ZEXT1632(auVar69));
      auVar36 = vsubps_avx(auVar66,auVar73);
      auVar86._0_4_ = auVar66._0_4_ + auVar73._0_4_;
      auVar86._4_4_ = auVar66._4_4_ + auVar73._4_4_;
      auVar86._8_4_ = auVar66._8_4_ + auVar73._8_4_;
      auVar86._12_4_ = auVar66._12_4_ + auVar73._12_4_;
      auVar86._16_4_ = auVar66._16_4_ + auVar73._16_4_;
      auVar86._20_4_ = auVar66._20_4_ + auVar73._20_4_;
      auVar86._24_4_ = auVar66._24_4_ + auVar73._24_4_;
      auVar86._28_4_ = auVar66._28_4_ + auVar73._28_4_;
      auVar73 = vsubps_avx(auVar78,auVar90);
      auVar95._0_4_ = auVar78._0_4_ + auVar90._0_4_;
      auVar95._4_4_ = auVar78._4_4_ + auVar90._4_4_;
      auVar95._8_4_ = auVar78._8_4_ + auVar90._8_4_;
      auVar95._12_4_ = auVar78._12_4_ + auVar90._12_4_;
      auVar95._16_4_ = auVar78._16_4_ + auVar90._16_4_;
      auVar95._20_4_ = auVar78._20_4_ + auVar90._20_4_;
      auVar95._24_4_ = auVar78._24_4_ + auVar90._24_4_;
      auVar95._28_4_ = auVar78._28_4_ + auVar90._28_4_;
      auVar90 = vsubps_avx(auVar83,auVar35);
      auVar80._0_4_ = auVar83._0_4_ + auVar35._0_4_;
      auVar80._4_4_ = auVar83._4_4_ + auVar35._4_4_;
      auVar80._8_4_ = auVar83._8_4_ + auVar35._8_4_;
      auVar80._12_4_ = auVar83._12_4_ + auVar35._12_4_;
      auVar80._16_4_ = auVar83._16_4_ + auVar35._16_4_;
      auVar80._20_4_ = auVar83._20_4_ + auVar35._20_4_;
      auVar80._24_4_ = auVar83._24_4_ + auVar35._24_4_;
      auVar80._28_4_ = fVar110 + fVar114;
      auVar83._4_4_ = auVar90._4_4_ * auVar95._4_4_;
      auVar83._0_4_ = auVar90._0_4_ * auVar95._0_4_;
      auVar83._8_4_ = auVar90._8_4_ * auVar95._8_4_;
      auVar83._12_4_ = auVar90._12_4_ * auVar95._12_4_;
      auVar83._16_4_ = auVar90._16_4_ * auVar95._16_4_;
      auVar83._20_4_ = auVar90._20_4_ * auVar95._20_4_;
      auVar83._24_4_ = auVar90._24_4_ * auVar95._24_4_;
      auVar83._28_4_ = fVar110;
      auVar70 = vfmsub231ps_fma(auVar83,auVar73,auVar80);
      auVar35._4_4_ = auVar80._4_4_ * auVar36._4_4_;
      auVar35._0_4_ = auVar80._0_4_ * auVar36._0_4_;
      auVar35._8_4_ = auVar80._8_4_ * auVar36._8_4_;
      auVar35._12_4_ = auVar80._12_4_ * auVar36._12_4_;
      auVar35._16_4_ = auVar80._16_4_ * auVar36._16_4_;
      auVar35._20_4_ = auVar80._20_4_ * auVar36._20_4_;
      auVar35._24_4_ = auVar80._24_4_ * auVar36._24_4_;
      auVar35._28_4_ = auVar80._28_4_;
      auVar69 = vfmsub231ps_fma(auVar35,auVar90,auVar86);
      auVar45._4_4_ = auVar73._4_4_ * auVar86._4_4_;
      auVar45._0_4_ = auVar73._0_4_ * auVar86._0_4_;
      auVar45._8_4_ = auVar73._8_4_ * auVar86._8_4_;
      auVar45._12_4_ = auVar73._12_4_ * auVar86._12_4_;
      auVar45._16_4_ = auVar73._16_4_ * auVar86._16_4_;
      auVar45._20_4_ = auVar73._20_4_ * auVar86._20_4_;
      auVar45._24_4_ = auVar73._24_4_ * auVar86._24_4_;
      auVar45._28_4_ = auVar86._28_4_;
      auVar71 = vfmsub231ps_fma(auVar45,auVar36,auVar95);
      auVar87._0_4_ = local_a60 * auVar71._0_4_;
      auVar87._4_4_ = local_a60 * auVar71._4_4_;
      auVar87._8_4_ = local_a60 * auVar71._8_4_;
      auVar87._12_4_ = local_a60 * auVar71._12_4_;
      auVar87._16_4_ = local_a60 * 0.0;
      auVar87._20_4_ = local_a60 * 0.0;
      auVar87._24_4_ = local_a60 * 0.0;
      auVar87._28_4_ = 0;
      auVar69 = vfmadd231ps_fma(auVar87,auVar122,ZEXT1632(auVar69));
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_a40,ZEXT1632(auVar70));
      local_9a0 = ZEXT1632(auVar65);
      local_9c0 = auVar34._0_4_;
      fStack_9bc = auVar34._4_4_;
      fStack_9b8 = auVar34._8_4_;
      fStack_9b4 = auVar34._12_4_;
      local_980 = ZEXT1632(CONCAT412(auVar69._12_4_ + auVar65._12_4_ + fStack_9b4,
                                     CONCAT48(auVar69._8_4_ + auVar65._8_4_ + fStack_9b8,
                                              CONCAT44(auVar69._4_4_ + auVar65._4_4_ + fStack_9bc,
                                                       auVar69._0_4_ + auVar65._0_4_ + local_9c0))))
      ;
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar81._16_4_ = 0x7fffffff;
      auVar81._20_4_ = 0x7fffffff;
      auVar81._24_4_ = 0x7fffffff;
      auVar81._28_4_ = 0x7fffffff;
      auVar66 = vminps_avx(ZEXT1632(auVar34),local_9a0);
      auVar66 = vminps_avx(auVar66,ZEXT1632(auVar69));
      local_b00 = vandps_avx(local_980,auVar81);
      fVar110 = local_b00._0_4_ * 1.1920929e-07;
      fVar114 = local_b00._4_4_ * 1.1920929e-07;
      auVar46._4_4_ = fVar114;
      auVar46._0_4_ = fVar110;
      fVar115 = local_b00._8_4_ * 1.1920929e-07;
      auVar46._8_4_ = fVar115;
      fVar116 = local_b00._12_4_ * 1.1920929e-07;
      auVar46._12_4_ = fVar116;
      fVar117 = local_b00._16_4_ * 1.1920929e-07;
      auVar46._16_4_ = fVar117;
      fVar118 = local_b00._20_4_ * 1.1920929e-07;
      auVar46._20_4_ = fVar118;
      fVar119 = local_b00._24_4_ * 1.1920929e-07;
      auVar46._24_4_ = fVar119;
      auVar46._28_4_ = 0x34000000;
      auVar106._0_8_ = CONCAT44(fVar114,fVar110) ^ 0x8000000080000000;
      auVar106._8_4_ = -fVar115;
      auVar106._12_4_ = -fVar116;
      auVar106._16_4_ = -fVar117;
      auVar106._20_4_ = -fVar118;
      auVar106._24_4_ = -fVar119;
      auVar106._28_4_ = 0xb4000000;
      auVar66 = vcmpps_avx(auVar66,auVar106,5);
      local_ae0 = ZEXT1632(auVar34);
      auVar83 = vmaxps_avx(local_ae0,local_9a0);
      auVar78 = vmaxps_avx(auVar83,ZEXT1632(auVar69));
      auVar78 = vcmpps_avx(auVar78,auVar46,2);
      auVar78 = vorps_avx(auVar66,auVar78);
      if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar78 >> 0x7f,0) != '\0') ||
            (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar78 >> 0xbf,0) != '\0') ||
          (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar78[0x1f] < '\0') {
        auVar47._4_4_ = fVar101 * auVar94._4_4_;
        auVar47._0_4_ = fVar98 * auVar94._0_4_;
        auVar47._8_4_ = fVar18 * auVar94._8_4_;
        auVar47._12_4_ = fVar21 * auVar94._12_4_;
        auVar47._16_4_ = fVar24 * auVar94._16_4_;
        auVar47._20_4_ = fVar27 * auVar94._20_4_;
        auVar47._24_4_ = fVar30 * auVar94._24_4_;
        auVar47._28_4_ = auVar66._28_4_;
        auVar48._4_4_ = fVar100 * local_a20._4_4_;
        auVar48._0_4_ = fVar97 * local_a20._0_4_;
        auVar48._8_4_ = fVar17 * local_a20._8_4_;
        auVar48._12_4_ = fVar20 * local_a20._12_4_;
        auVar48._16_4_ = fVar23 * local_a20._16_4_;
        auVar48._20_4_ = fVar26 * local_a20._20_4_;
        auVar48._24_4_ = fVar29 * local_a20._24_4_;
        auVar48._28_4_ = 0x34000000;
        auVar34 = vfmsub213ps_fma(local_a20,local_aa0,auVar47);
        auVar49._4_4_ = auVar73._4_4_ * fVar99;
        auVar49._0_4_ = auVar73._0_4_ * fVar96;
        auVar49._8_4_ = auVar73._8_4_ * fVar16;
        auVar49._12_4_ = auVar73._12_4_ * fVar19;
        auVar49._16_4_ = auVar73._16_4_ * fVar22;
        auVar49._20_4_ = auVar73._20_4_ * fVar25;
        auVar49._24_4_ = auVar73._24_4_ * fVar28;
        auVar49._28_4_ = auVar83._28_4_;
        auVar50._4_4_ = fVar100 * auVar90._4_4_;
        auVar50._0_4_ = fVar97 * auVar90._0_4_;
        auVar50._8_4_ = fVar17 * auVar90._8_4_;
        auVar50._12_4_ = fVar20 * auVar90._12_4_;
        auVar50._16_4_ = fVar23 * auVar90._16_4_;
        auVar50._20_4_ = fVar26 * auVar90._20_4_;
        auVar50._24_4_ = fVar29 * auVar90._24_4_;
        auVar50._28_4_ = local_b00._28_4_;
        auVar69 = vfmsub213ps_fma(auVar90,local_a80,auVar49);
        auVar66 = vandps_avx(auVar47,auVar81);
        auVar83 = vandps_avx(auVar49,auVar81);
        auVar66 = vcmpps_avx(auVar66,auVar83,1);
        local_960 = vblendvps_avx(ZEXT1632(auVar69),ZEXT1632(auVar34),auVar66);
        auVar51._4_4_ = fVar101 * auVar36._4_4_;
        auVar51._0_4_ = fVar98 * auVar36._0_4_;
        auVar51._8_4_ = fVar18 * auVar36._8_4_;
        auVar51._12_4_ = fVar21 * auVar36._12_4_;
        auVar51._16_4_ = fVar24 * auVar36._16_4_;
        auVar51._20_4_ = fVar27 * auVar36._20_4_;
        auVar51._24_4_ = fVar30 * auVar36._24_4_;
        auVar51._28_4_ = auVar66._28_4_;
        auVar34 = vfmsub213ps_fma(auVar36,local_aa0,auVar50);
        auVar52._4_4_ = auVar67._4_4_ * fVar99;
        auVar52._0_4_ = auVar67._0_4_ * fVar96;
        auVar52._8_4_ = auVar67._8_4_ * fVar16;
        auVar52._12_4_ = auVar67._12_4_ * fVar19;
        auVar52._16_4_ = auVar67._16_4_ * fVar22;
        auVar52._20_4_ = auVar67._20_4_ * fVar25;
        auVar52._24_4_ = auVar67._24_4_ * fVar28;
        auVar52._28_4_ = auVar83._28_4_;
        auVar69 = vfmsub213ps_fma(auVar94,local_ac0,auVar52);
        auVar66 = vandps_avx(auVar52,auVar81);
        auVar83 = vandps_avx(auVar50,auVar81);
        auVar66 = vcmpps_avx(auVar66,auVar83,1);
        local_940 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar69),auVar66);
        auVar34 = vfmsub213ps_fma(auVar67,local_a80,auVar48);
        auVar69 = vfmsub213ps_fma(auVar73,local_ac0,auVar51);
        auVar66 = vandps_avx(auVar48,auVar81);
        auVar83 = vandps_avx(auVar51,auVar81);
        auVar66 = vcmpps_avx(auVar66,auVar83,1);
        local_920 = vblendvps_avx(ZEXT1632(auVar69),ZEXT1632(auVar34),auVar66);
        auVar34 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
        fVar110 = local_920._0_4_;
        auVar82._0_4_ = fVar110 * local_a60;
        fVar96 = local_920._4_4_;
        auVar82._4_4_ = fVar96 * local_a60;
        fVar97 = local_920._8_4_;
        auVar82._8_4_ = fVar97 * local_a60;
        fVar98 = local_920._12_4_;
        auVar82._12_4_ = fVar98 * local_a60;
        fVar99 = local_920._16_4_;
        auVar82._16_4_ = fVar99 * local_a60;
        fVar100 = local_920._20_4_;
        auVar82._20_4_ = fVar100 * local_a60;
        fVar101 = local_920._24_4_;
        auVar82._24_4_ = fVar101 * local_a60;
        auVar82._28_4_ = 0;
        auVar69 = vfmadd213ps_fma(auVar122,local_940,auVar82);
        auVar69 = vfmadd213ps_fma(local_a40,local_960,ZEXT1632(auVar69));
        auVar83 = ZEXT1632(CONCAT412(auVar69._12_4_ + auVar69._12_4_,
                                     CONCAT48(auVar69._8_4_ + auVar69._8_4_,
                                              CONCAT44(auVar69._4_4_ + auVar69._4_4_,
                                                       auVar69._0_4_ + auVar69._0_4_))));
        auVar53._4_4_ = fVar96 * fVar10;
        auVar53._0_4_ = fVar110 * fVar9;
        auVar53._8_4_ = fVar97 * fVar11;
        auVar53._12_4_ = fVar98 * fVar12;
        auVar53._16_4_ = fVar99 * fVar13;
        auVar53._20_4_ = fVar100 * fVar14;
        auVar53._24_4_ = fVar101 * fVar15;
        auVar53._28_4_ = auVar78._28_4_;
        auVar69 = vfmadd213ps_fma(local_cc0,local_940,auVar53);
        auVar70 = vfmadd213ps_fma(auVar85,local_960,ZEXT1632(auVar69));
        auVar66 = vrcpps_avx(auVar83);
        auVar120._8_4_ = 0x3f800000;
        auVar120._0_8_ = 0x3f8000003f800000;
        auVar120._12_4_ = 0x3f800000;
        auVar120._16_4_ = 0x3f800000;
        auVar120._20_4_ = 0x3f800000;
        auVar120._24_4_ = 0x3f800000;
        auVar120._28_4_ = 0x3f800000;
        auVar69 = vfnmadd213ps_fma(auVar66,auVar83,auVar120);
        auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar66,auVar66);
        local_8a0 = ZEXT1632(CONCAT412(auVar69._12_4_ * (auVar70._12_4_ + auVar70._12_4_),
                                       CONCAT48(auVar69._8_4_ * (auVar70._8_4_ + auVar70._8_4_),
                                                CONCAT44(auVar69._4_4_ *
                                                         (auVar70._4_4_ + auVar70._4_4_),
                                                         auVar69._0_4_ *
                                                         (auVar70._0_4_ + auVar70._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar109._4_4_ = uVar1;
        auVar109._0_4_ = uVar1;
        auVar109._8_4_ = uVar1;
        auVar109._12_4_ = uVar1;
        auVar109._16_4_ = uVar1;
        auVar109._20_4_ = uVar1;
        auVar109._24_4_ = uVar1;
        auVar109._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_c20._4_4_ = uVar1;
        local_c20._0_4_ = uVar1;
        local_c20._8_4_ = uVar1;
        local_c20._12_4_ = uVar1;
        local_c20._16_4_ = uVar1;
        local_c20._20_4_ = uVar1;
        local_c20._24_4_ = uVar1;
        local_c20._28_4_ = uVar1;
        auVar66 = vcmpps_avx(auVar109,local_8a0,2);
        auVar78 = vcmpps_avx(local_8a0,local_c20,2);
        auVar66 = vandps_avx(auVar66,auVar78);
        auVar69 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
        auVar34 = vpand_avx(auVar69,auVar34);
        auVar66 = vpmovsxwd_avx2(auVar34);
        if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0x7f,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar66 >> 0xbf,0) != '\0') ||
            (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar66[0x1f] < '\0') {
          auVar66 = vcmpps_avx(auVar83,_DAT_01f7b000,4);
          auVar69 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
          auVar34 = vpand_avx(auVar34,auVar69);
          local_900 = vpmovsxwd_avx2(auVar34);
          if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_900 >> 0x7f,0) != '\0') ||
                (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_900 >> 0xbf,0) != '\0') ||
              (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_900[0x1f] < '\0') {
            auStack_c38 = auVar94._8_24_;
            uStack_9b0 = 0;
            uStack_9ac = 0;
            uStack_9a8 = 0;
            uStack_9a4 = 0;
            local_820 = local_b20;
            auVar66 = vrcpps_avx(local_980);
            auVar93._8_4_ = 0x3f800000;
            auVar93._0_8_ = 0x3f8000003f800000;
            auVar93._12_4_ = 0x3f800000;
            auVar93._16_4_ = 0x3f800000;
            auVar93._20_4_ = 0x3f800000;
            auVar93._24_4_ = 0x3f800000;
            auVar93._28_4_ = 0x3f800000;
            auVar69 = vfnmadd213ps_fma(local_980,auVar66,auVar93);
            auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar66,auVar66);
            auVar88._8_4_ = 0x219392ef;
            auVar88._0_8_ = 0x219392ef219392ef;
            auVar88._12_4_ = 0x219392ef;
            auVar88._16_4_ = 0x219392ef;
            auVar88._20_4_ = 0x219392ef;
            auVar88._24_4_ = 0x219392ef;
            auVar88._28_4_ = 0x219392ef;
            auVar66 = vcmpps_avx(local_b00,auVar88,5);
            auVar66 = vandps_avx(auVar66,ZEXT1632(auVar69));
            auVar54._4_4_ = fStack_9bc * auVar66._4_4_;
            auVar54._0_4_ = local_9c0 * auVar66._0_4_;
            auVar54._8_4_ = fStack_9b8 * auVar66._8_4_;
            auVar54._12_4_ = fStack_9b4 * auVar66._12_4_;
            auVar54._16_4_ = auVar66._16_4_ * 0.0;
            auVar54._20_4_ = auVar66._20_4_ * 0.0;
            auVar54._24_4_ = auVar66._24_4_ * 0.0;
            auVar54._28_4_ = 0;
            auVar78 = vminps_avx(auVar54,auVar93);
            auVar74._0_4_ = auVar65._0_4_ * auVar66._0_4_;
            auVar74._4_4_ = auVar65._4_4_ * auVar66._4_4_;
            auVar74._8_4_ = auVar65._8_4_ * auVar66._8_4_;
            auVar74._12_4_ = auVar65._12_4_ * auVar66._12_4_;
            auVar74._16_4_ = auVar66._16_4_ * 0.0;
            auVar74._20_4_ = auVar66._20_4_ * 0.0;
            auVar74._24_4_ = auVar66._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar66 = vminps_avx(auVar74,auVar93);
            auVar83 = vsubps_avx(auVar93,auVar78);
            auVar73 = vsubps_avx(auVar93,auVar66);
            local_8c0 = vblendvps_avx(auVar66,auVar83,local_b20);
            local_8e0 = vblendvps_avx(auVar78,auVar73,local_b20);
            local_860._4_4_ = (float)local_b40._4_4_ * local_940._4_4_;
            local_860._0_4_ = (float)local_b40._0_4_ * local_940._0_4_;
            local_860._8_4_ = fStack_b38 * local_940._8_4_;
            local_860._12_4_ = fStack_b34 * local_940._12_4_;
            local_860._16_4_ = fStack_b30 * local_940._16_4_;
            local_860._20_4_ = fStack_b2c * local_940._20_4_;
            local_860._24_4_ = fStack_b28 * local_940._24_4_;
            local_860._28_4_ = local_8c0._28_4_;
            local_880[0] = local_960._0_4_ * (float)local_b40._0_4_;
            local_880[1] = local_960._4_4_ * (float)local_b40._4_4_;
            local_880[2] = local_960._8_4_ * fStack_b38;
            local_880[3] = local_960._12_4_ * fStack_b34;
            fStack_870 = local_960._16_4_ * fStack_b30;
            fStack_86c = local_960._20_4_ * fStack_b2c;
            fStack_868 = local_960._24_4_ * fStack_b28;
            uStack_864 = local_8e0._28_4_;
            local_840[0] = (float)local_b40._0_4_ * fVar110;
            local_840[1] = (float)local_b40._4_4_ * fVar96;
            local_840[2] = fStack_b38 * fVar97;
            local_840[3] = fStack_b34 * fVar98;
            fStack_830 = fStack_b30 * fVar99;
            fStack_82c = fStack_b2c * fVar100;
            fStack_828 = fStack_b28 * fVar101;
            uStack_824 = uStack_b24;
            auVar34 = vpacksswb_avx(auVar34,auVar34);
            uVar56 = (ulong)(byte)(SUB161(auVar34 >> 7,0) & 1 | (SUB161(auVar34 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar34 >> 0x3f,0) << 7);
            auStack_c58 = auVar85._8_24_;
            local_c60 = context->scene;
            pSVar58 = context->scene;
            fStack_a5c = local_a60;
            fStack_a58 = local_a60;
            fStack_a54 = local_a60;
            fStack_a50 = local_a60;
            fStack_a4c = local_a60;
            fStack_a48 = local_a60;
            fStack_a44 = local_a60;
            do {
              uVar59 = 0;
              for (uVar38 = uVar56; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                uVar59 = uVar59 + 1;
              }
              uVar55 = *(uint *)((long)&local_9e0 + uVar59 * 4);
              pGVar7 = (pSVar58->geometries).items[uVar55].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_cc0._0_8_ = uVar59;
                local_c00._0_8_ = uVar56;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar56 = (ulong)(uint)((int)uVar59 * 4);
                  local_ba0 = *(undefined4 *)(local_8e0 + uVar56);
                  uVar1 = *(undefined4 *)(local_8c0 + uVar56);
                  local_b90._4_4_ = uVar1;
                  local_b90._0_4_ = uVar1;
                  local_b90._8_4_ = uVar1;
                  local_b90._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar56);
                  local_c90.context = context->user;
                  local_b70._4_4_ = uVar55;
                  local_b70._0_4_ = uVar55;
                  local_b70._8_4_ = uVar55;
                  local_b70._12_4_ = uVar55;
                  local_b80 = *(undefined4 *)((long)&local_a00 + uVar56);
                  local_bd0 = *(undefined4 *)((long)local_880 + uVar56);
                  uVar1 = *(undefined4 *)(local_860 + uVar56);
                  local_bc0._4_4_ = uVar1;
                  local_bc0._0_4_ = uVar1;
                  local_bc0._8_4_ = uVar1;
                  local_bc0._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)((long)local_840 + uVar56);
                  local_bb0._4_4_ = uVar1;
                  local_bb0._0_4_ = uVar1;
                  local_bb0._8_4_ = uVar1;
                  local_bb0._12_4_ = uVar1;
                  vpcmpeqd_avx2(ZEXT1632(local_b70),ZEXT1632(local_b70));
                  uStack_b5c = (local_c90.context)->instID[0];
                  local_b60 = uStack_b5c;
                  uStack_b58 = uStack_b5c;
                  uStack_b54 = uStack_b5c;
                  uStack_b50 = (local_c90.context)->instPrimID[0];
                  uStack_b4c = uStack_b50;
                  uStack_b48 = uStack_b50;
                  uStack_b44 = uStack_b50;
                  local_cf0 = *local_cd8;
                  local_c90.valid = (int *)local_cf0;
                  local_c90.geometryUserPtr = pGVar7->userPtr;
                  local_c90.hit = (RTCHitN *)&local_bd0;
                  local_c90.N = 4;
                  local_c90.ray = (RTCRayN *)ray;
                  uStack_bcc = local_bd0;
                  uStack_bc8 = local_bd0;
                  uStack_bc4 = local_bd0;
                  uStack_b9c = local_ba0;
                  uStack_b98 = local_ba0;
                  uStack_b94 = local_ba0;
                  uStack_b7c = local_b80;
                  uStack_b78 = local_b80;
                  uStack_b74 = local_b80;
                  if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->occlusionFilterN)(&local_c90);
                  }
                  if (local_cf0 == (undefined1  [16])0x0) {
                    auVar34 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar34 = auVar34 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_c90);
                    }
                    auVar65 = vpcmpeqd_avx(local_cf0,_DAT_01f45a50);
                    auVar34 = auVar65 ^ _DAT_01f46b70;
                    auVar77._8_4_ = 0xff800000;
                    auVar77._0_8_ = 0xff800000ff800000;
                    auVar77._12_4_ = 0xff800000;
                    auVar65 = vblendvps_avx(auVar77,*(undefined1 (*) [16])(local_c90.ray + 0x80),
                                            auVar65);
                    *(undefined1 (*) [16])(local_c90.ray + 0x80) = auVar65;
                  }
                  auVar72._8_8_ = 0x100000001;
                  auVar72._0_8_ = 0x100000001;
                  if ((auVar72 & auVar34) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_c20._0_4_;
                    uVar56 = local_c00._0_8_ ^ 1L << (local_cc0._0_8_ & 0x3f);
                    goto LAB_0158d5f2;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_0158d6f3;
              }
              uVar56 = uVar56 ^ 1L << (uVar59 & 0x3f);
LAB_0158d5f2:
              pSVar58 = local_c60;
            } while (uVar56 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }